

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O0

void __thiscall
duckdb::PartialBlockManager::AllocateBlock
          (PartialBlockManager *this,PartialBlockState *state,uint32_t segment_size)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined8 *in_RSI;
  BlockManager *in_RDI;
  
  if ((in_RDI->blocks_lock).super___mutex_base._M_mutex.__data.__lock == 0) {
    iVar1 = (*in_RDI->buffer_manager->_vptr_BufferManager[4])();
    *in_RSI = CONCAT44(extraout_var,iVar1);
  }
  else {
    *in_RSI = 0xffffffffffffffff;
  }
  BlockManager::GetBlockSize(in_RDI);
  uVar2 = NumericCast<unsigned_int,unsigned_long,void>(0xc5b8b0);
  *(uint *)(in_RSI + 1) = uVar2;
  *(undefined4 *)((long)in_RSI + 0xc) = 0;
  *(undefined4 *)(in_RSI + 2) = 1;
  return;
}

Assistant:

void PartialBlockManager::AllocateBlock(PartialBlockState &state, uint32_t segment_size) {
	D_ASSERT(segment_size <= block_manager.GetBlockSize());
	if (partial_block_type == PartialBlockType::FULL_CHECKPOINT) {
		state.block_id = block_manager.GetFreeBlockId();
	} else {
		state.block_id = INVALID_BLOCK;
	}
	state.block_size = NumericCast<uint32_t>(block_manager.GetBlockSize());
	state.offset = 0;
	state.block_use_count = 1;
}